

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall
DropdownMenu::DropdownMenu(DropdownMenu *this,TextButton *button,Color *backgroundColor)

{
  Vector2f *pVVar1;
  long in_RSI;
  undefined8 *in_RDI;
  TextButton *in_stack_ffffffffffffff78;
  TextButton *in_stack_ffffffffffffff80;
  Transformable *pTVar2;
  Vector2f *in_stack_ffffffffffffff88;
  RectangleShape *in_stack_ffffffffffffff90;
  TextButton *in_stack_ffffffffffffffa0;
  Vector2<float> local_34;
  Vector2<float> local_2c [3];
  long local_10;
  
  local_10 = in_RSI;
  UIComponent::UIComponent((UIComponent *)in_stack_ffffffffffffff90);
  *in_RDI = &PTR__DropdownMenu_002bc1b8;
  in_RDI[1] = &PTR__DropdownMenu_002bc1f0;
  TextButton::TextButton(in_stack_ffffffffffffffa0);
  sf::Vector2<float>::Vector2(local_2c,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::vector<TextButton,_std::allocator<TextButton>_>::vector
            ((vector<TextButton,_std::allocator<TextButton>_> *)0x1a7f71);
  TextButton::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sf::Vector2<float>::Vector2(&local_34,0.0,4.0);
  sf::RectangleShape::setSize
            ((RectangleShape *)in_stack_ffffffffffffff80,(Vector2f *)in_stack_ffffffffffffff78);
  sf::Shape::setFillColor((Shape *)in_stack_ffffffffffffff80,(Color *)in_stack_ffffffffffffff78);
  pTVar2 = (Transformable *)(in_RDI + 0x8e);
  pVVar1 = sf::RectangleShape::getSize((RectangleShape *)(local_10 + 0x228));
  sf::Transformable::setPosition(pTVar2,0.0,pVVar1->y);
  pTVar2 = (Transformable *)(in_RDI + 1);
  sf::Transformable::getPosition((Transformable *)(local_10 + 8));
  sf::Transformable::setPosition(pTVar2,(Vector2f *)in_stack_ffffffffffffff78);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x18),0.0,0.0);
  *(undefined4 *)(in_RDI + 0xbb) = 0;
  *(undefined1 *)((long)in_RDI + 0xb1) = 0;
  return;
}

Assistant:

DropdownMenu::DropdownMenu(const TextButton& button, const Color& backgroundColor) {
    this->button = button;
    
    background.setSize(Vector2f(0.0f, 4.0f));
    background.setFillColor(backgroundColor);
    background.setPosition(0.0f, button.button.getSize().y);
    
    setPosition(button.getPosition());
    this->button.setPosition(0.0f, 0.0f);
    maxMenuButtonWidth = 0.0f;
    visible = false;
}